

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::Image
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *a)

{
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *a_local;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this_local;
  
  this->depth = a->depth;
  this->width = a->width;
  this->height = a->height;
  this->n = a->n;
  this->pixel = a->pixel;
  this->row = a->row;
  this->img = a->img;
  a->depth = 0;
  a->width = 0;
  a->height = 0;
  a->n = 0;
  a->pixel = (unsigned_short *)0x0;
  a->row = (unsigned_short **)0x0;
  a->img = (unsigned_short ***)0x0;
  return;
}

Assistant:

Image(Image<T> &&a) noexcept
    {
      depth=a.depth;
      width=a.width;
      height=a.height;
      n=a.n;
      pixel=a.pixel;
      row=a.row;
      img=a.img;

      a.depth=0;
      a.width=0;
      a.height=0;
      a.n=0;
      a.pixel=0;
      a.row=0;
      a.img=0;
    }